

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printUnaryPrefix(JSPrinter *this,Ref node)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char cVar4;
  Ref *pRVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  Ref local_28;
  Ref node_local;
  
  local_28.inst = node.inst;
  if (this->finalize == true) {
    pRVar5 = Ref::operator[](&local_28,1);
    bVar3 = Ref::operator==(pRVar5,(IString *)&PLUS);
    if (bVar3) {
      pRVar5 = Ref::operator[](&local_28,2);
      if (pRVar5->inst->type == Number) {
LAB_00d0f0f6:
        iVar1 = (int)this->used;
        pRVar5 = Ref::operator[](&local_28,2);
        print(this,pRVar5->inst);
        ensure(this,1);
        pcVar8 = this->buffer;
        pcVar8[this->used] = '\0';
        pcVar8 = pcVar8 + iVar1;
        pcVar6 = strstr(pcVar8,"Infinity");
        if (pcVar6 != (char *)0x0) {
          return;
        }
        pcVar6 = strstr(pcVar8,"NaN");
        if (pcVar6 != (char *)0x0) {
          return;
        }
        pcVar6 = strchr(pcVar8,0x2e);
        if (pcVar6 != (char *)0x0) {
          return;
        }
        pcVar8 = strchr(pcVar8,0x65);
        if (pcVar8 != (char *)0x0) {
          ensure(this,3);
          pcVar6 = this->buffer;
          sVar7 = strlen(pcVar6 + iVar1);
          for (pcVar6 = pcVar6 + iVar1 + sVar7; pcVar8 <= pcVar6; pcVar6 = pcVar6 + -1) {
            pcVar6[2] = *pcVar6;
          }
          pcVar8[0] = '.';
          pcVar8[1] = '0';
          this->used = this->used + 2;
          return;
        }
        emit(this,".0");
        return;
      }
      pRVar5 = Ref::operator[](&local_28,2);
      if (pRVar5->inst->type == Array) {
        pRVar5 = Ref::operator[](&local_28,2);
        pRVar5 = Ref::operator[](pRVar5,0);
        bVar3 = Ref::operator==(pRVar5,(IString *)&UNARY_PREFIX);
        if (bVar3) {
          pRVar5 = Ref::operator[](&local_28,2);
          pRVar5 = Ref::operator[](pRVar5,1);
          bVar3 = Ref::operator==(pRVar5,(IString *)&MINUS);
          if (bVar3) {
            pRVar5 = Ref::operator[](&local_28,2);
            pRVar5 = Ref::operator[](pRVar5,2);
            if (pRVar5->inst->type == Number) goto LAB_00d0f0f6;
          }
        }
      }
    }
  }
  cVar4 = this->buffer[this->used - 1];
  if (cVar4 == '-') {
    pRVar5 = Ref::operator[](&local_28,1);
    bVar3 = Ref::operator==(pRVar5,(IString *)&MINUS);
    if (!bVar3) {
      cVar4 = this->buffer[this->used - 1];
      goto LAB_00d0f295;
    }
  }
  else {
LAB_00d0f295:
    if (cVar4 != '+') goto LAB_00d0f2e8;
    pRVar5 = Ref::operator[](&local_28,1);
    bVar3 = Ref::operator==(pRVar5,(IString *)&PLUS);
    if (!bVar3) goto LAB_00d0f2e8;
  }
  maybeSpace(this,' ');
  ensure(this,1);
  sVar2 = this->used;
  this->used = sVar2 + 1;
  this->buffer[sVar2] = ' ';
LAB_00d0f2e8:
  pRVar5 = Ref::operator[](&local_28,1);
  if (pRVar5->inst->type == String) {
    emit(this,(pRVar5->inst->field_1).str.str._M_str);
    pRVar5 = Ref::operator[](&local_28,2);
    printChild(this,pRVar5->inst,local_28,1);
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xeb,"const char *cashew::Value::getCString()");
}

Assistant:

void printUnaryPrefix(Ref node) {
    if (finalize && node[1] == PLUS &&
        (node[2]->isNumber() ||
         (node[2]->isArray() && node[2][0] == UNARY_PREFIX &&
          node[2][1] == MINUS && node[2][2]->isNumber()))) {
      // emit a finalized number
      int last = used;
      print(node[2]);
      ensure(1);                  // we temporarily append a 0
      char* curr = buffer + last; // ensure might invalidate
      buffer[used] = 0;
      if (strstr(curr, "Infinity")) {
        return;
      }
      if (strstr(curr, "NaN")) {
        return;
      }
      if (strchr(curr, '.')) {
        return; // already a decimal point, all good
      }
      char* e = strchr(curr, 'e');
      if (!e) {
        emit(".0");
        return;
      }
      ensure(3);
      curr = buffer + last; // ensure might invalidate
      char* end = strchr(curr, 0);
      while (end >= e) {
        end[2] = end[0];
        end--;
      }
      e[0] = '.';
      e[1] = '0';
      used += 2;
      return;
    }
    if ((buffer[used - 1] == '-' && node[1] == MINUS) ||
        (buffer[used - 1] == '+' && node[1] == PLUS)) {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(node[1]->getCString());
    printChild(node[2], node, 1);
  }